

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator+(uchar lhs,SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs
         )

{
  uint uVar1;
  undefined3 in_register_00000039;
  
  uVar1 = (uint)rhs.m_int + CONCAT31(in_register_00000039,lhs);
  if (uVar1 < 0x100) {
    return (SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>)
           (uchar)uVar1;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void AdditionThrow( const T& lhs, const U& rhs, T& result ) SAFEINT_CPP_THROW
    {
        //16-bit or less unsigned addition
        std::int32_t tmp = lhs + rhs;

        if( tmp <= (std::int32_t)std::numeric_limits<T>::max() )
        {
            result = (T)tmp;
            return;
        }

        E::SafeIntOnOverflow();
    }